

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O0

EStatusCode __thiscall
DecryptionHelper::Setup(DecryptionHelper *this,PDFParser *inParser,string *inPassword)

{
  PDFArray **this_00;
  bool bVar1;
  uint uVar2;
  PDFDictionary *pPVar3;
  PDFObject *pPVar4;
  PDFName *pPVar5;
  string *psVar6;
  undefined8 uVar7;
  Trace *pTVar8;
  longlong lVar9;
  PDFBoolean *this_01;
  PDFArray *pPVar10;
  unsigned_long uVar11;
  mapped_type inValue;
  key_type this_02;
  XCryptionCommon *pXVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_bool>
  pVar13;
  byte local_9f3;
  uint local_8d0;
  undefined1 local_5b0 [8];
  ByteList password;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
  local_588;
  XCryptionCommon *local_560;
  XCryptionCommon *defaultEncryption;
  string local_550;
  byte local_52a;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  undefined1 local_4e0 [8];
  PDFObjectCastPtr<PDFName> stringsFilterName;
  string local_4c8;
  undefined1 local_4a8 [8];
  PDFObjectCastPtr<PDFName> streamsFilterName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
  local_488;
  XCryptionCommon *local_460;
  XCryptionCommon *encryption;
  uint length_1;
  undefined1 local_430 [8];
  RefCountPtr<PDFObject> lengthObject;
  string local_418;
  undefined1 local_3f8 [8];
  PDFObjectCastPtr<PDFName> cfmName;
  PDFObjectCastPtr<PDFDictionary> cryptFilter;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  cryptFiltersIt;
  string local_3b8;
  undefined1 local_398 [8];
  PDFObjectCastPtr<PDFDictionary> cryptFilters;
  string local_380;
  undefined1 local_360 [8];
  RefCountPtr<PDFObject> length;
  ByteList local_330;
  ParsedPrimitiveHelper local_318;
  ParsedPrimitiveHelper idPart1ObjectHelper;
  RefCountPtr<PDFObject> idPart1Object;
  string local_2f8;
  undefined1 local_2d8 [8];
  PDFObjectCastPtr<PDFArray> idArray;
  allocator<char> local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  PDFObjectCastPtr<PDFBoolean> encryptMetadata;
  ParsedPrimitiveHelper pHelper;
  string local_268;
  undefined1 local_248 [8];
  RefCountPtr<PDFObject> p;
  ByteList local_218;
  ParsedPrimitiveHelper local_200;
  ParsedPrimitiveHelper uHelper;
  string local_1f0;
  undefined1 local_1d0 [8];
  RefCountPtr<PDFObject> u;
  ByteList local_1a0;
  ParsedPrimitiveHelper local_188;
  ParsedPrimitiveHelper oHelper;
  string local_178;
  undefined1 local_158 [8];
  RefCountPtr<PDFObject> o;
  ParsedPrimitiveHelper revisionHelper;
  string local_138;
  undefined1 local_118 [8];
  RefCountPtr<PDFObject> revision;
  ParsedPrimitiveHelper vHelper;
  string local_f8;
  undefined1 local_d8 [8];
  RefCountPtr<PDFObject> v;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  PDFObjectCastPtr<PDFName> filter;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  PDFObjectCastPtr<PDFDictionary> encryptionDictionary;
  string *inPassword_local;
  PDFParser *inParser_local;
  DecryptionHelper *this_local;
  
  this->mSupportsDecryption = false;
  this->mFailedPasswordVerification = false;
  this->mDidSucceedOwnerPasswordVerification = false;
  this->mParser = inParser;
  encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue = (PDFDictionary *)inPassword;
  pPVar3 = PDFParser::GetTrailer(inParser);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Encrypt",&local_51);
  pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_50);
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)local_30,pPVar4);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
  this->mIsEncrypted = pPVar3 != (PDFDictionary *)0x0;
  if ((this->mIsEncrypted & 1U) == 0) goto LAB_002b7845;
  pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Filter",&local_99);
  pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_98);
  PDFObjectCastPtr<PDFName>::PDFObjectCastPtr((PDFObjectCastPtr<PDFName> *)local_78,pPVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  bVar1 = RefCountPtr<PDFName>::operator!((RefCountPtr<PDFName> *)local_78);
  if (bVar1) {
LAB_002b5a32:
    bVar1 = RefCountPtr<PDFName>::operator!((RefCountPtr<PDFName> *)local_78);
    if (bVar1) {
      pTVar8 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar8,"DecryptionHelper::Setup, no filter defined");
    }
    else {
      pTVar8 = Trace::DefaultTrace();
      pPVar5 = RefCountPtr<PDFName>::operator->((RefCountPtr<PDFName> *)local_78);
      psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)psVar6);
      uVar7 = std::__cxx11::string::c_str();
      Trace::TraceToLog(pTVar8,
                        "DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s"
                        ,uVar7);
      std::__cxx11::string::~string(local_c0);
    }
    v.mValue._4_4_ = 2;
  }
  else {
    pPVar5 = RefCountPtr<PDFName>::operator->((RefCountPtr<PDFName> *)local_78);
    psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
    bVar1 = std::operator!=(psVar6,"Standard");
    if (bVar1) goto LAB_002b5a32;
    pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"V",(allocator<char> *)((long)&vHelper.mWrappedObject + 7));
    pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_f8);
    RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_d8,pPVar4);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vHelper.mWrappedObject + 7));
    bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_d8);
    if (bVar1) {
      this->mV = 0;
LAB_002b5d4c:
      if (((this->mV == 1) || (this->mV == 2)) || (this->mV == 4)) {
        pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"R",
                   (allocator<char> *)((long)&revisionHelper.mWrappedObject + 7));
        pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_138);
        RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_118,pPVar4);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&revisionHelper.mWrappedObject + 7));
        bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_118);
        if (bVar1) {
          v.mValue._4_4_ = 2;
        }
        else {
          pPVar4 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_118);
          ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&o.mValue,pPVar4);
          bVar1 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&o.mValue);
          if (bVar1) {
            lVar9 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&o.mValue);
            this->mRevision = (uint)lVar9;
            v.mValue._4_4_ = 0;
          }
          else {
            v.mValue._4_4_ = 2;
          }
          ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&o.mValue);
          if (v.mValue._4_4_ == 0) {
            pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_178,"O",
                       (allocator<char> *)((long)&oHelper.mWrappedObject + 7));
            pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_178);
            RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_158,pPVar4);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator((allocator<char> *)((long)&oHelper.mWrappedObject + 7))
            ;
            bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_158);
            if (bVar1) {
              v.mValue._4_4_ = 2;
            }
            else {
              pPVar4 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_158);
              ParsedPrimitiveHelper::ParsedPrimitiveHelper(&local_188,pPVar4);
              ParsedPrimitiveHelper::ToString_abi_cxx11_((string *)&u.mValue,&local_188);
              XCryptionCommon::stringToByteList(&local_1a0,(string *)&u.mValue);
              std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&this->mO,&local_1a0);
              std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_1a0);
              std::__cxx11::string::~string((string *)&u.mValue);
              ParsedPrimitiveHelper::~ParsedPrimitiveHelper(&local_188);
              pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f0,"U",
                         (allocator<char> *)((long)&uHelper.mWrappedObject + 7));
              pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_1f0);
              RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_1d0,pPVar4);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)&uHelper.mWrappedObject + 7));
              bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_1d0);
              if (bVar1) {
                v.mValue._4_4_ = 2;
              }
              else {
                pPVar4 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_1d0);
                ParsedPrimitiveHelper::ParsedPrimitiveHelper(&local_200,pPVar4);
                ParsedPrimitiveHelper::ToString_abi_cxx11_((string *)&p.mValue,&local_200);
                XCryptionCommon::stringToByteList(&local_218,(string *)&p.mValue);
                std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          (&this->mU,&local_218);
                std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_218)
                ;
                std::__cxx11::string::~string((string *)&p.mValue);
                ParsedPrimitiveHelper::~ParsedPrimitiveHelper(&local_200);
                pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_30);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_268,"P",
                           (allocator<char> *)((long)&pHelper.mWrappedObject + 7));
                pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_268);
                RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_248,pPVar4);
                std::__cxx11::string::~string((string *)&local_268);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&pHelper.mWrappedObject + 7));
                bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_248);
                if (bVar1) {
                  v.mValue._4_4_ = 2;
                }
                else {
                  pPVar4 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_248);
                  ParsedPrimitiveHelper::ParsedPrimitiveHelper
                            ((ParsedPrimitiveHelper *)
                             &encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue,pPVar4);
                  bVar1 = ParsedPrimitiveHelper::IsNumber
                                    ((ParsedPrimitiveHelper *)
                                     &encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue);
                  if (bVar1) {
                    lVar9 = ParsedPrimitiveHelper::GetAsInteger
                                      ((ParsedPrimitiveHelper *)
                                       &encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue);
                    this->mP = lVar9;
                    v.mValue._4_4_ = 0;
                  }
                  else {
                    v.mValue._4_4_ = 2;
                  }
                  ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                            ((ParsedPrimitiveHelper *)
                             &encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue);
                  if (v.mValue._4_4_ == 0) {
                    pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                       ((RefCountPtr<PDFDictionary> *)local_30);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2a8,"EncryptMetadata",&local_2a9);
                    pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_2a8);
                    PDFObjectCastPtr<PDFBoolean>::PDFObjectCastPtr
                              ((PDFObjectCastPtr<PDFBoolean> *)local_288,pPVar4);
                    std::__cxx11::string::~string((string *)&local_2a8);
                    std::allocator<char>::~allocator(&local_2a9);
                    bVar1 = RefCountPtr<PDFBoolean>::operator!((RefCountPtr<PDFBoolean> *)local_288)
                    ;
                    if (bVar1) {
                      this->mEncryptMetaData = true;
                    }
                    else {
                      this_01 = RefCountPtr<PDFBoolean>::operator->
                                          ((RefCountPtr<PDFBoolean> *)local_288);
                      bVar1 = PDFBoolean::GetValue(this_01);
                      this->mEncryptMetaData = bVar1;
                    }
                    idArray.super_RefCountPtr<PDFArray>.mValue = (PDFArray *)0x0;
                    this_00 = &idArray.super_RefCountPtr<PDFArray>.mValue;
                    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list
                              ((list<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
                    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                              (&this->mFileIDPart1,
                               (list<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
                    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
                              ((list<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
                    pPVar3 = PDFParser::GetTrailer(inParser);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2f8,"ID",
                               (allocator<char> *)((long)&idPart1Object.mValue + 7));
                    pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_2f8);
                    PDFObjectCastPtr<PDFArray>::PDFObjectCastPtr
                              ((PDFObjectCastPtr<PDFArray> *)local_2d8,pPVar4);
                    std::__cxx11::string::~string((string *)&local_2f8);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)((long)&idPart1Object.mValue + 7));
                    bVar1 = RefCountPtr<PDFArray>::operator!((RefCountPtr<PDFArray> *)local_2d8);
                    if (!bVar1) {
                      pPVar10 = RefCountPtr<PDFArray>::operator->
                                          ((RefCountPtr<PDFArray> *)local_2d8);
                      uVar11 = PDFArray::GetLength(pPVar10);
                      if (uVar11 != 0) {
                        pPVar10 = RefCountPtr<PDFArray>::GetPtr((RefCountPtr<PDFArray> *)local_2d8);
                        pPVar4 = PDFParser::QueryArrayObject(inParser,pPVar10,0);
                        RefCountPtr<PDFObject>::RefCountPtr
                                  ((RefCountPtr<PDFObject> *)&idPart1ObjectHelper,pPVar4);
                        bVar1 = RefCountPtr<PDFObject>::operator!
                                          ((RefCountPtr<PDFObject> *)&idPart1ObjectHelper);
                        if (!bVar1) {
                          pPVar4 = RefCountPtr<PDFObject>::GetPtr
                                             ((RefCountPtr<PDFObject> *)&idPart1ObjectHelper);
                          ParsedPrimitiveHelper::ParsedPrimitiveHelper(&local_318,pPVar4);
                          ParsedPrimitiveHelper::ToString_abi_cxx11_
                                    ((string *)&length.mValue,&local_318);
                          XCryptionCommon::stringToByteList(&local_330,(string *)&length.mValue);
                          std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                          operator=(&this->mFileIDPart1,&local_330);
                          std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
                                    (&local_330);
                          std::__cxx11::string::~string((string *)&length.mValue);
                          ParsedPrimitiveHelper::~ParsedPrimitiveHelper(&local_318);
                        }
                        RefCountPtr<PDFObject>::~RefCountPtr
                                  ((RefCountPtr<PDFObject> *)&idPart1ObjectHelper);
                      }
                    }
                    pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                       ((RefCountPtr<PDFDictionary> *)local_30);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_380,"Length",
                               (allocator<char> *)
                               ((long)&cryptFilters.super_RefCountPtr<PDFDictionary>.mValue + 7));
                    pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_380);
                    RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_360,pPVar4);
                    std::__cxx11::string::~string((string *)&local_380);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&cryptFilters.super_RefCountPtr<PDFDictionary>.mValue + 7));
                    bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_360);
                    if (bVar1) {
                      this->mLength = 5;
                    }
                    else {
                      pPVar4 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_360);
                      uVar2 = ComputeByteLength(pPVar4);
                      this->mLength = uVar2;
                    }
                    if (this->mV == 4) {
                      pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                         ((RefCountPtr<PDFDictionary> *)local_30);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3b8,"CF",
                                 (allocator<char> *)
                                 ((long)&cryptFiltersIt.
                                         super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                         .mCurrentPosition._M_node + 7));
                      pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_3b8);
                      PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
                                ((PDFObjectCastPtr<PDFDictionary> *)local_398,pPVar4);
                      std::__cxx11::string::~string((string *)&local_3b8);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)
                                 ((long)&cryptFiltersIt.
                                         super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                         .mCurrentPosition._M_node + 7));
                      bVar1 = RefCountPtr<PDFDictionary>::operator!
                                        ((RefCountPtr<PDFDictionary> *)local_398);
                      if (!bVar1) {
                        pPVar3 = RefCountPtr<PDFDictionary>::operator->
                                           ((RefCountPtr<PDFDictionary> *)local_398);
                        PDFDictionary::GetIterator
                                  ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                    *)&cryptFilter.super_RefCountPtr<PDFDictionary>.mValue,pPVar3);
                        while (bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       ::MoveNext((
                                                  ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  *)&cryptFilter.super_RefCountPtr<PDFDictionary>.
                                                     mValue), bVar1) {
                          PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
                                    ((PDFObjectCastPtr<PDFDictionary> *)
                                     &cfmName.super_RefCountPtr<PDFName>.mValue);
                          inValue = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                    ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                *)&cryptFilter.super_RefCountPtr<PDFDictionary>.
                                                   mValue);
                          PDFObjectCastPtr<PDFDictionary>::operator=
                                    ((PDFObjectCastPtr<PDFDictionary> *)
                                     &cfmName.super_RefCountPtr<PDFName>.mValue,inValue);
                          bVar1 = RefCountPtr<PDFDictionary>::operator!
                                            ((RefCountPtr<PDFDictionary> *)
                                             &cfmName.super_RefCountPtr<PDFName>.mValue);
                          if (!bVar1) {
                            pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                               ((RefCountPtr<PDFDictionary> *)
                                                &cfmName.super_RefCountPtr<PDFName>.mValue);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_418,"CFM",
                                       (allocator<char> *)((long)&lengthObject.mValue + 7));
                            pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_418);
                            PDFObjectCastPtr<PDFName>::PDFObjectCastPtr
                                      ((PDFObjectCastPtr<PDFName> *)local_3f8,pPVar4);
                            std::__cxx11::string::~string((string *)&local_418);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)((long)&lengthObject.mValue + 7));
                            pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                               ((RefCountPtr<PDFDictionary> *)
                                                &cfmName.super_RefCountPtr<PDFName>.mValue);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&length_1,"Length",
                                       (allocator<char> *)((long)&encryption + 7));
                            pPVar4 = PDFParser::QueryDictionaryObject
                                               (inParser,pPVar3,(string *)&length_1);
                            RefCountPtr<PDFObject>::RefCountPtr
                                      ((RefCountPtr<PDFObject> *)local_430,pPVar4);
                            std::__cxx11::string::~string((string *)&length_1);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)((long)&encryption + 7));
                            bVar1 = RefCountPtr<PDFObject>::operator!
                                              ((RefCountPtr<PDFObject> *)local_430);
                            if (bVar1) {
                              local_8d0 = this->mLength;
                            }
                            else {
                              pPVar4 = RefCountPtr<PDFObject>::GetPtr
                                                 ((RefCountPtr<PDFObject> *)local_430);
                              local_8d0 = ComputeByteLength(pPVar4);
                            }
                            encryption._0_4_ = local_8d0;
                            pXVar12 = (XCryptionCommon *)operator_new(0x58);
                            XCryptionCommon::XCryptionCommon(pXVar12);
                            local_460 = pXVar12;
                            pPVar5 = RefCountPtr<PDFName>::operator->
                                               ((RefCountPtr<PDFName> *)local_3f8);
                            psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
                            bVar1 = std::operator==(psVar6,"AESV2");
                            XCryptionCommon::Setup(pXVar12,bVar1);
                            XCryptionCommon::SetupInitialEncryptionKey
                                      (local_460,
                                       (string *)
                                       encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue,
                                       this->mRevision,(uint)encryption,&this->mO,this->mP,
                                       &this->mFileIDPart1,(bool)(this->mEncryptMetaData & 1));
                            this_02 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                      ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                *)&cryptFilter.super_RefCountPtr<PDFDictionary>.
                                                   mValue);
                            psVar6 = PDFName::GetValue_abi_cxx11_(this_02);
                            std::
                            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                            ::pair<XCryptionCommon_*&,_true>(&local_488,psVar6,&local_460);
                            pVar13 = std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                     ::insert(&this->mXcrypts,&local_488);
                            streamsFilterName.super_RefCountPtr<PDFName>.mValue =
                                 (PDFName *)pVar13.first._M_node;
                            std::
                            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                            ::~pair(&local_488);
                            RefCountPtr<PDFObject>::~RefCountPtr
                                      ((RefCountPtr<PDFObject> *)local_430);
                            PDFObjectCastPtr<PDFName>::~PDFObjectCastPtr
                                      ((PDFObjectCastPtr<PDFName> *)local_3f8);
                          }
                          PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
                                    ((PDFObjectCastPtr<PDFDictionary> *)
                                     &cfmName.super_RefCountPtr<PDFName>.mValue);
                        }
                        pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                           ((RefCountPtr<PDFDictionary> *)local_30);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_4c8,"StmF",
                                   (allocator<char> *)
                                   ((long)&stringsFilterName.super_RefCountPtr<PDFName>.mValue + 7))
                        ;
                        pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_4c8);
                        PDFObjectCastPtr<PDFName>::PDFObjectCastPtr
                                  ((PDFObjectCastPtr<PDFName> *)local_4a8,pPVar4);
                        std::__cxx11::string::~string((string *)&local_4c8);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)
                                   ((long)&stringsFilterName.super_RefCountPtr<PDFName>.mValue + 7))
                        ;
                        pPVar3 = RefCountPtr<PDFDictionary>::GetPtr
                                           ((RefCountPtr<PDFDictionary> *)local_30);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_500,"StrF",&local_501);
                        pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_500);
                        PDFObjectCastPtr<PDFName>::PDFObjectCastPtr
                                  ((PDFObjectCastPtr<PDFName> *)local_4e0,pPVar4);
                        std::__cxx11::string::~string((string *)&local_500);
                        std::allocator<char>::~allocator(&local_501);
                        local_52a = 0;
                        bVar1 = RefCountPtr<PDFName>::operator!((RefCountPtr<PDFName> *)local_4a8);
                        if (bVar1) {
                          std::allocator<char>::allocator();
                          local_52a = 1;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_528,"Identity",&local_529);
                        }
                        else {
                          pPVar5 = RefCountPtr<PDFName>::operator->
                                             ((RefCountPtr<PDFName> *)local_4a8);
                          psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
                          std::__cxx11::string::string((string *)&local_528,(string *)psVar6);
                        }
                        pXVar12 = GetFilterForName(&this->mXcrypts,&local_528);
                        this->mXcryptStreams = pXVar12;
                        std::__cxx11::string::~string((string *)&local_528);
                        if ((local_52a & 1) != 0) {
                          std::allocator<char>::~allocator(&local_529);
                        }
                        defaultEncryption._6_1_ = 0;
                        bVar1 = RefCountPtr<PDFName>::operator!((RefCountPtr<PDFName> *)local_4e0);
                        if (bVar1) {
                          std::allocator<char>::allocator();
                          defaultEncryption._6_1_ = 1;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_550,"Identity",
                                     (allocator<char> *)((long)&defaultEncryption + 7));
                        }
                        else {
                          pPVar5 = RefCountPtr<PDFName>::operator->
                                             ((RefCountPtr<PDFName> *)local_4e0);
                          psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
                          std::__cxx11::string::string((string *)&local_550,(string *)psVar6);
                        }
                        pXVar12 = GetFilterForName(&this->mXcrypts,&local_550);
                        this->mXcryptStrings = pXVar12;
                        std::__cxx11::string::~string((string *)&local_550);
                        if ((defaultEncryption._6_1_ & 1) != 0) {
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&defaultEncryption + 7));
                        }
                        pXVar12 = GetFilterForName(&this->mXcrypts,&scStdCF_abi_cxx11_);
                        this->mXcryptAuthentication = pXVar12;
                        PDFObjectCastPtr<PDFName>::~PDFObjectCastPtr
                                  ((PDFObjectCastPtr<PDFName> *)local_4e0);
                        PDFObjectCastPtr<PDFName>::~PDFObjectCastPtr
                                  ((PDFObjectCastPtr<PDFName> *)local_4a8);
                      }
                      PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
                                ((PDFObjectCastPtr<PDFDictionary> *)local_398);
                    }
                    else {
                      pXVar12 = (XCryptionCommon *)operator_new(0x58);
                      XCryptionCommon::XCryptionCommon(pXVar12);
                      local_560 = pXVar12;
                      XCryptionCommon::Setup(pXVar12,false);
                      XCryptionCommon::SetupInitialEncryptionKey
                                (local_560,
                                 (string *)
                                 encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue,
                                 this->mRevision,this->mLength,&this->mO,this->mP,
                                 &this->mFileIDPart1,(bool)(this->mEncryptMetaData & 1));
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                      ::pair<XCryptionCommon_*&,_true>(&local_588,&scStdCF_abi_cxx11_,&local_560);
                      pVar13 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                               ::insert(&this->mXcrypts,&local_588);
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node._M_size = (size_t)pVar13.first._M_node;
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                      ::~pair(&local_588);
                      this->mXcryptStreams = local_560;
                      this->mXcryptStrings = local_560;
                      this->mXcryptAuthentication = local_560;
                    }
                    XCryptionCommon::stringToByteList
                              ((ByteList *)local_5b0,
                               (string *)
                               encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue);
                    bVar1 = AuthenticateOwnerPassword(this,(ByteList *)local_5b0);
                    this->mDidSucceedOwnerPasswordVerification = bVar1;
                    local_9f3 = 0;
                    if ((this->mDidSucceedOwnerPasswordVerification & 1U) == 0) {
                      bVar1 = AuthenticateUserPassword(this,(ByteList *)local_5b0);
                      local_9f3 = bVar1 ^ 0xff;
                    }
                    this->mFailedPasswordVerification = (bool)(local_9f3 & 1);
                    this->mSupportsDecryption = true;
                    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
                              ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_5b0);
                    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_360);
                    PDFObjectCastPtr<PDFArray>::~PDFObjectCastPtr
                              ((PDFObjectCastPtr<PDFArray> *)local_2d8);
                    PDFObjectCastPtr<PDFBoolean>::~PDFObjectCastPtr
                              ((PDFObjectCastPtr<PDFBoolean> *)local_288);
                    v.mValue._4_4_ = 0;
                  }
                }
                RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_248);
              }
              RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_1d0);
            }
            RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_158);
          }
        }
        RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_118);
      }
      else {
        pTVar8 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar8,
                          "DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d"
                          ,(ulong)this->mV);
        v.mValue._4_4_ = 2;
      }
    }
    else {
      pPVar4 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_d8);
      ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&revision.mValue,pPVar4)
      ;
      bVar1 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&revision.mValue);
      if (bVar1) {
        lVar9 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&revision.mValue);
        this->mV = (uint)lVar9;
        v.mValue._4_4_ = 0;
      }
      else {
        v.mValue._4_4_ = 2;
      }
      ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&revision.mValue);
      if (v.mValue._4_4_ == 0) goto LAB_002b5d4c;
    }
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_d8);
  }
  PDFObjectCastPtr<PDFName>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFName> *)local_78);
LAB_002b7845:
  v.mValue._4_4_ = 1;
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFDictionary> *)local_30);
  return eSuccess;
}

Assistant:

EStatusCode DecryptionHelper::Setup(PDFParser* inParser, const string& inPassword) {
	mSupportsDecryption = false;
	mFailedPasswordVerification = false;
	mDidSucceedOwnerPasswordVerification = false;
	mParser = inParser;

	// setup encrypted flag through the existance of encryption dict
	PDFObjectCastPtr<PDFDictionary> encryptionDictionary(inParser->QueryDictionaryObject(inParser->GetTrailer(), "Encrypt"));
	mIsEncrypted = encryptionDictionary.GetPtr() != NULL;

	do {
		if (!mIsEncrypted)
			break;

		PDFObjectCastPtr<PDFName> filter(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Filter"));
		if (!filter || filter->GetValue() != "Standard") {
			// Supporting only standard filter
			if(!filter)
				TRACE_LOG("DecryptionHelper::Setup, no filter defined");
			else
				TRACE_LOG1("DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s",filter->GetValue().substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}

		RefCountPtr<PDFObject> v(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "V"));
		if (!v) {
			mV = 0;
		} else {
			ParsedPrimitiveHelper vHelper(v.GetPtr());
			if (!vHelper.IsNumber())
				break;
			mV = (unsigned int)vHelper.GetAsInteger();
		}

		// supporting versions 1,2 and 4
		if (mV != 1 && mV != 2 && mV != 4) {
			TRACE_LOG1("DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d", mV);
			break;
		}

		RefCountPtr<PDFObject> revision(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "R"));
		if (!revision) {
			break;
		}
		else {
			ParsedPrimitiveHelper revisionHelper(revision.GetPtr());
			if (!revisionHelper.IsNumber())
				break;
			mRevision = (unsigned int)revisionHelper.GetAsInteger();
		}

		RefCountPtr<PDFObject> o(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "O"));
		if (!o) {
			break;
		}
		else {
			ParsedPrimitiveHelper oHelper(o.GetPtr());
			mO = XCryptionCommon::stringToByteList(oHelper.ToString());
		}

		RefCountPtr<PDFObject> u(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "U"));
		if (!u) {
			break;
		}
		else {
			ParsedPrimitiveHelper uHelper(u.GetPtr());
			mU = XCryptionCommon::stringToByteList(uHelper.ToString());
		}

		RefCountPtr<PDFObject> p(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "P"));
		if (!p) {
			break;
		}
		else {
			ParsedPrimitiveHelper pHelper(p.GetPtr());
			if (!pHelper.IsNumber())
				break;
			mP = pHelper.GetAsInteger();
		}

		PDFObjectCastPtr<PDFBoolean> encryptMetadata(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "EncryptMetadata"));
		if (!encryptMetadata) {
			mEncryptMetaData = true;
		}
		else {
			mEncryptMetaData = encryptMetadata->GetValue();
		}

		// grab file ID from trailer
		mFileIDPart1 = ByteList();
		PDFObjectCastPtr<PDFArray> idArray(inParser->QueryDictionaryObject(inParser->GetTrailer(), "ID"));
		if (!!idArray && idArray->GetLength() > 0) {
			RefCountPtr<PDFObject> idPart1Object(inParser->QueryArrayObject(idArray.GetPtr(), 0));
			if (!!idPart1Object) {
				ParsedPrimitiveHelper idPart1ObjectHelper(idPart1Object.GetPtr());
				mFileIDPart1 = XCryptionCommon::stringToByteList(idPart1ObjectHelper.ToString());
			}
		}


		RefCountPtr<PDFObject> length(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Length"));
		if (!length) {
			mLength = 40 / 8;
		}
		else {
			mLength = ComputeByteLength(length.GetPtr());
		}

		// Setup crypt filters, or a default filter
		if (mV == 4) {
			// multiple xcryptions. read crypt filters, determine which does what
			PDFObjectCastPtr<PDFDictionary> cryptFilters(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "CF"));
			if (!!cryptFilters) {
				MapIterator<PDFNameToPDFObjectMap>  cryptFiltersIt = cryptFilters->GetIterator();

				// read crypt filters
				while (cryptFiltersIt.MoveNext())
				{
					PDFObjectCastPtr<PDFDictionary> cryptFilter;
					// A little caveat of those smart ptrs need to be handled here
					// make sure to pass the pointer after init...otherwise cast wont do addref
					// and object will be released
					cryptFilter = cryptFiltersIt.GetValue();
					if (!!cryptFilter) {
						PDFObjectCastPtr<PDFName> cfmName(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "CFM"));
						RefCountPtr<PDFObject> lengthObject(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "Length"));
						unsigned int length = !lengthObject ? mLength : ComputeByteLength(lengthObject.GetPtr());

						XCryptionCommon* encryption = new XCryptionCommon();
						encryption->Setup(cfmName->GetValue() == "AESV2"); // singe xcryptions are always RC4
						encryption->SetupInitialEncryptionKey(
							inPassword,
							mRevision,
							length,
							mO,
							mP,
							mFileIDPart1,
							mEncryptMetaData);
						mXcrypts.insert(StringToXCryptionCommonMap::value_type(cryptFiltersIt.GetKey()->GetValue(), encryption));
					}
				}
				

				PDFObjectCastPtr<PDFName> streamsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StmF"));
				PDFObjectCastPtr<PDFName> stringsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StrF"));
				mXcryptStreams = GetFilterForName(mXcrypts, !streamsFilterName ? "Identity": streamsFilterName->GetValue());
				mXcryptStrings = GetFilterForName(mXcrypts, !stringsFilterName ? "Identity" : stringsFilterName->GetValue());
				mXcryptAuthentication = GetFilterForName(mXcrypts, scStdCF);
			}

		}
		else {
			// single xcryption, use as the single encryption source
			XCryptionCommon* defaultEncryption = new XCryptionCommon();
			defaultEncryption->Setup(false); // single xcryptions are always RC4
			defaultEncryption->SetupInitialEncryptionKey(
				inPassword,
				mRevision,
				mLength,
				mO,
				mP,
				mFileIDPart1,
				mEncryptMetaData);

			mXcrypts.insert(StringToXCryptionCommonMap::value_type(scStdCF, defaultEncryption));
			mXcryptStreams = defaultEncryption;
			mXcryptStrings = defaultEncryption;
			mXcryptAuthentication = defaultEncryption;
		}

		// authenticate password, try to determine if user or owner
		ByteList password = XCryptionCommon::stringToByteList(inPassword);
		mDidSucceedOwnerPasswordVerification = AuthenticateOwnerPassword(password);
		mFailedPasswordVerification = !mDidSucceedOwnerPasswordVerification && !AuthenticateUserPassword(password);


		mSupportsDecryption = true;
	}while(false);

	return eSuccess;
}